

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

void __thiscall vmips::Function::Function(Function *this,string *name,size_t argc)

{
  size_t sVar1;
  shared_ptr<vmips::VirtReg> local_60;
  shared_ptr<vmips::VirtReg> local_50 [2];
  shared_ptr<vmips::VirtReg> local_30;
  size_t local_20;
  size_t argc_local;
  string *name_local;
  Function *this_local;
  
  local_20 = argc;
  argc_local = (size_t)name;
  name_local = &this->name;
  std::__cxx11::string::string((string *)this,(string *)name);
  this->count = 0;
  this->memory_count = 0;
  MemoryLocation::MemoryLocation(&this->ra_location);
  MemoryLocation::MemoryLocation(&this->pic_location);
  MemoryLocation::MemoryLocation(&this->s8_location);
  std::vector<std::shared_ptr<vmips::Data>,_std::allocator<std::shared_ptr<vmips::Data>_>_>::vector
            (&this->data_blocks);
  std::
  vector<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
  ::vector(&this->mem_blocks);
  this->has_sub = false;
  this->allocated = false;
  this->sub_argc = 0;
  this->save_regs = 0;
  this->stack_size = 0;
  this->argc = local_20;
  std::vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>::
  vector(&this->blocks);
  std::shared_ptr<vmips::CFGNode>::shared_ptr(&this->cursor);
  (this->ra_location).status = Undetermined;
  sVar1 = this->memory_count;
  this->memory_count = sVar1 + 1;
  (this->ra_location).identifier = sVar1;
  (this->ra_location).size = 4;
  get_special((vmips *)&local_30,sp);
  std::shared_ptr<vmips::VirtReg>::operator=(&(this->ra_location).base,&local_30);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_30);
  (this->pic_location).status = Undetermined;
  sVar1 = this->memory_count;
  this->memory_count = sVar1 + 1;
  (this->pic_location).identifier = sVar1;
  (this->pic_location).size = 4;
  get_special((vmips *)local_50,sp);
  std::shared_ptr<vmips::VirtReg>::operator=(&(this->pic_location).base,local_50);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(local_50);
  (this->s8_location).status = Undetermined;
  sVar1 = this->memory_count;
  this->memory_count = sVar1 + 1;
  (this->s8_location).identifier = sVar1;
  (this->s8_location).size = 4;
  get_special((vmips *)&local_60,sp);
  std::shared_ptr<vmips::VirtReg>::operator=(&(this->s8_location).base,&local_60);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_60);
  return;
}

Assistant:

Function::Function(std::string name, size_t argc) : name(std::move(name)), argc(argc) {
    ra_location.status = MemoryLocation::Undetermined;
    ra_location.identifier = memory_count++;
    ra_location.size = 4;
    ra_location.base = get_special(SpecialReg::sp);

    pic_location.status = MemoryLocation::Undetermined;
    pic_location.identifier = memory_count++;
    pic_location.size = 4;
    pic_location.base = get_special(SpecialReg::sp);

    s8_location.status = MemoryLocation::Undetermined;
    s8_location.identifier = memory_count++;
    s8_location.size = 4;
    s8_location.base = get_special(SpecialReg::sp);
}